

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2DataBuilder::setUnicodeVersion(Normalizer2DataBuilder *this,char *v)

{
  undefined4 extraout_EDX;
  undefined4 uVar1;
  uint8_t *puVar2;
  undefined1 *puVar3;
  UVersionInfo version;
  char buffer [20];
  int local_3c;
  undefined1 local_38 [32];
  
  u_versionFromString_63((uint8_t *)&local_3c,v);
  puVar2 = this->unicodeVersion;
  if ((local_3c == *(int *)this->unicodeVersion) || (*(int *)this->unicodeVersion == 0)) {
    *(int *)puVar2 = local_3c;
    return;
  }
  puVar3 = local_38;
  setUnicodeVersion();
  if (puVar2 != (uint8_t *)0x0) {
    if ((int)*(long *)(puVar2 + 0x18) != 0) {
      if (*(int *)(puVar3 + 0xcc) == 2) {
        if (*(int *)(puVar2 + 0x14) == *(int *)(puVar3 + 200)) goto LAB_001dcd43;
      }
      else if (*(int *)(puVar3 + 0xcc) == 0) {
LAB_001dcd43:
        uVar1 = extraout_EDX;
        checkNormForMapping();
        *(undefined4 *)(puVar3 + 0xcc) = uVar1;
        *(int *)(puVar3 + 200) = *(int *)(puVar3 + 200) + 1;
        return;
      }
      if (*(long **)puVar2 != (long *)0x0) {
        (**(code **)(**(long **)puVar2 + 8))();
      }
      *(long *)puVar2 = 0;
    }
    *(undefined4 *)(puVar2 + 0x14) = *(undefined4 *)(puVar3 + 200);
  }
  return;
}

Assistant:

void
Normalizer2DataBuilder::setUnicodeVersion(const char *v) {
    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    UVersionInfo version;
    u_versionFromString(version, v);
    if( 0!=memcmp(version, unicodeVersion, U_MAX_VERSION_LENGTH) &&
        0!=memcmp(nullVersion, unicodeVersion, U_MAX_VERSION_LENGTH)
    ) {
        char buffer[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, buffer);
        fprintf(stderr, "gennorm2 error: multiple inconsistent Unicode version numbers %s vs. %s\n",
                buffer, v);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }
    memcpy(unicodeVersion, version, U_MAX_VERSION_LENGTH);
}